

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_generator.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::anon_unknown_1::StringToBool
               (string *value,bool *result)

{
  bool bVar1;
  undefined1 local_40 [8];
  string upper_value;
  bool *result_local;
  string *value_local;
  
  upper_value.field_2._8_8_ = result;
  std::__cxx11::string::string((string *)local_40,(string *)value);
  UpperString((string *)local_40);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"NO");
  if (bVar1) {
    *(undefined1 *)upper_value.field_2._8_8_ = 0;
    value_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"YES");
    if (bVar1) {
      *(undefined1 *)upper_value.field_2._8_8_ = 1;
      value_local._7_1_ = true;
    }
    else {
      value_local._7_1_ = false;
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return value_local._7_1_;
}

Assistant:

bool StringToBool(const std::string& value, bool* result) {
  std::string upper_value(value);
  UpperString(&upper_value);
  if (upper_value == "NO") {
    *result = false;
    return true;
  }
  if (upper_value == "YES") {
    *result = true;
    return true;
  }

  return false;
}